

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O1

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::_build(ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
         *this)

{
  long *plVar1;
  ulong uVar2;
  Task *this_00;
  bool bVar3;
  char cVar4;
  Node *pNVar5;
  undefined8 *puVar6;
  char cVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong __val;
  in_place_type_t<tf::Node::Condition> local_a2;
  DefaultTaskParams local_a1;
  long *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 uStack_88;
  string __str;
  undefined2 *local_60;
  long local_58;
  undefined2 local_50;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined4 uStack_4c;
  anon_class_16_2_fd512dd9 local_40;
  
  local_a0 = (long *)0x0;
  local_60 = (undefined2 *)0x0;
  local_40.this =
       (ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
        *)((ulong)local_40.this & 0xffffffff00000000);
  __str._M_dataplus._M_p = (pointer)this;
  pNVar5 = Graph::
           _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Condition>,tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void(tf::Pipeflow&)>>*,std::vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>>>::_build()::_lambda()_1_>
                     (&this->_graph,&NSTATE::NONE,&ESTATE::NONE,&local_a1,&local_a0,&local_60,
                      (int *)&local_40,&local_a2,(anon_class_8_1_8991fb9c *)&__str);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"cond","");
  std::__cxx11::string::_M_assign((string *)&pNVar5->_name);
  ((this->_tasks).super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
   super__Vector_impl_data._M_start)->_node = pNVar5;
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((this->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __val = 0;
    do {
      local_a0 = (long *)0x0;
      local_60 = (undefined2 *)0x0;
      __str._M_dataplus._M_p = __str._M_dataplus._M_p & 0xffffffff00000000;
      local_40.this = this;
      local_40.l = __val;
      pNVar5 = Graph::
               _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Runtime>,tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void(tf::Pipeflow&)>>*,std::vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>>>::_build()::_lambda(tf::Runtime&)_1_>
                         (&this->_graph,&NSTATE::NONE,&ESTATE::NONE,&local_a1,&local_a0,&local_60,
                          (int *)&__str,(in_place_type_t<tf::Node::Runtime> *)&local_a2,&local_40);
      uStack_4e = 0x2d;
      local_50 = 0x7472;
      local_58 = 3;
      uStack_4d = 0;
      cVar7 = '\x01';
      if (9 < __val) {
        uVar8 = __val;
        cVar4 = '\x04';
        do {
          cVar7 = cVar4;
          if (uVar8 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_00135dbf;
          }
          if (uVar8 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_00135dbf;
          }
          if (uVar8 < 10000) goto LAB_00135dbf;
          bVar3 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
          cVar4 = cVar7 + '\x04';
        } while (bVar3);
        cVar7 = cVar7 + '\x01';
      }
LAB_00135dbf:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      local_60 = &local_50;
      std::__cxx11::string::_M_construct((ulong)&__str,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,__val);
      uVar8 = 0xf;
      if (local_60 != &local_50) {
        uVar8 = CONCAT44(uStack_4c,CONCAT13(uStack_4d,CONCAT12(uStack_4e,local_50)));
      }
      uVar2 = CONCAT44(__str._M_string_length._4_4_,(uint)__str._M_string_length) + local_58;
      if (uVar8 < uVar2) {
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          uVar9 = __str.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < uVar2) goto LAB_00135e2a;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,(ulong)local_60);
      }
      else {
LAB_00135e2a:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_60,(ulong)__str._M_dataplus._M_p);
      }
      plVar1 = puVar6 + 2;
      if ((long *)*puVar6 == plVar1) {
        local_90 = *plVar1;
        uStack_88 = puVar6[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar1;
        local_a0 = (long *)*puVar6;
      }
      local_98 = puVar6[1];
      *puVar6 = plVar1;
      puVar6[1] = 0;
      *(undefined1 *)plVar1 = 0;
      std::__cxx11::string::_M_assign((string *)&pNVar5->_name);
      (this->_tasks).super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
      super__Vector_impl_data._M_start[__val + 1]._node = pNVar5;
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT44(uStack_4c,CONCAT13(uStack_4d,CONCAT12(uStack_4e,local_50))
                                         ) + 1);
      }
      __val = __val + 1;
      this_00 = (this->_tasks).super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                super__Vector_impl_data._M_start;
      Task::precede<tf::Task&>(this_00,this_00 + __val);
    } while (__val < (ulong)(((long)(this->_pipeflows).
                                    super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_pipeflows).
                                    super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 5) *
                            -0x5555555555555555));
  }
  return;
}

Assistant:

void ScalablePipeline<P>::_build() {

  using namespace std::literals::string_literals;

  FlowBuilder fb(_graph);
  
  // init task
  _tasks[0] = fb.emplace([this]() {
    return static_cast<int>(_num_tokens % num_lines());
  }).name("cond");

  // line task
  for(size_t l = 0; l < num_lines(); l++) {
    
    _tasks[l + 1] = fb.emplace([this, l] (tf::Runtime& rt) mutable {

      auto pf = &_pipeflows[l];

      pipeline:

      _line(pf->_line, pf->_pipe).join_counter.store(
        static_cast<size_t>(_pipes[pf->_pipe]->type()), std::memory_order_relaxed
      );

      // First pipe does all jobs of initialization and token dependencies
      if (pf->_pipe == 0) {
        // _ready_tokens queue is not empty
        // substitute pf with the token at the front of the queue
        if (!_ready_tokens.empty()) {
          pf->_token = _ready_tokens.front().first;
          pf->_num_deferrals = _ready_tokens.front().second;
          _ready_tokens.pop();
        }
        else {
          pf->_token = _num_tokens;
          pf->_num_deferrals = 0;
        }
      
      handle_token_dependency: 

        if (pf->_stop = false, _on_pipe(*pf, rt); pf->_stop == true) {
          // here, the pipeline is not stopped yet because other
          // lines of tasks may still be running their last stages
          return;
        }
        
        if (_num_tokens == pf->_token) {
          ++_num_tokens;
        }
      
        if (pf->_dependents.empty() == false){ 
          // check if the pf->_dependents have valid dependents
          _check_dependents(*pf); 
          
          // tokens in pf->_dependents are all valid dependents 
          if (pf->_dependents.size()) {
            
            // construct a data structure for pf in _deferred_tokens 
            _construct_deferred_tokens(*pf);
            goto pipeline;
          }

          // tokens in pf->_dependents are invalid dependents
          // directly goto on_pipe on the same line
          else {
            goto handle_token_dependency;
          }
        }
        
        // Every token within the deferral range needs to check
        // if it can resolve dependencies on other tokens.
        if (pf->_token <= _longest_deferral) {
          _resolve_token_dependencies(*pf); 
        }
      }
      else {
        _on_pipe(*pf, rt);
      }
      
      size_t c_f = pf->_pipe;
      size_t n_f = (pf->_pipe + 1) % num_pipes();
      size_t n_l = (pf->_line + 1) % num_lines();
      
      pf->_pipe = n_f;

      // ---- scheduling starts here ----
      // Notice that the shared variable f must not be changed after this
      // point because it can result in data race due to the following
      // condition:
      //
      // a -> b
      // |    |
      // v    v
      // c -> d
      //
      // d will be spawned by either c or b, so if c changes f but b spawns d
      // then data race on f will happen

      std::array<int, 2> retval;
      size_t n = 0;

      // downward dependency
      if(_pipes[c_f]->type() == PipeType::SERIAL &&
         _line(n_l, c_f).join_counter.fetch_sub(
           1, std::memory_order_acq_rel) == 1
        ) {
        retval[n++] = 1;
      }

      // forward dependency
      if(_line(pf->_line, n_f).join_counter.fetch_sub(
          1, std::memory_order_acq_rel) == 1
        ) {
        retval[n++] = 0;
      }

      // notice that the task index starts from 1
      switch(n) {
        case 2: {
          rt.schedule(_tasks[n_l+1]);
          goto pipeline;
        }
        case 1: {
          if (retval[0] == 1) {
            pf = &_pipeflows[n_l];
          }
          goto pipeline;
        }
      }
    }).name("rt-"s + std::to_string(l));

    _tasks[0].precede(_tasks[l+1]);
  }
}